

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int editPage(MemPage *pPg,int iOld,int iNew,int nNew,CellArray *pCArray)

{
  u8 *puVar1;
  u16 uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  u8 *pBegin;
  undefined4 in_register_00000014;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  u8 *pData;
  u8 *local_58;
  undefined8 local_50;
  u8 *local_48;
  ulong local_40;
  ulong local_38;
  
  local_50 = CONCAT44(in_register_00000014,iNew);
  local_48 = pPg->aData;
  pBegin = pPg->aCellIdx + nNew * 2;
  local_40 = (ulong)pPg->hdrOffset;
  uVar3 = pPg->nCell;
  uVar12 = (uint)uVar3;
  iVar9 = (uint)pPg->nOverflow + (uint)uVar3 + iOld;
  iVar6 = nNew + iNew;
  local_38 = (ulong)(uint)(iOld - iNew);
  if (iOld < iNew) {
    iVar4 = pageFreeArray(pPg,iOld,iNew - iOld,pCArray);
    memmove(pPg->aCellIdx,pPg->aCellIdx + iVar4 * 2,(ulong)((uint)uVar3 * 2));
    uVar12 = (uint)uVar3 - iVar4;
  }
  puVar1 = local_48;
  iVar4 = iVar9 - iVar6;
  if (iVar4 != 0 && iVar6 <= iVar9) {
    iVar6 = pageFreeArray(pPg,iVar6,iVar4,pCArray);
    uVar12 = uVar12 - iVar6;
  }
  uVar10 = local_50;
  iVar6 = (int)local_50;
  uVar3 = *(ushort *)(puVar1 + local_40 + 5);
  local_58 = puVar1 + (ulong)((ushort)(uVar3 << 8 | uVar3 >> 8) - 1 & 0xffff) + 1;
  if (pBegin <= local_58) {
    if (iVar6 < iOld) {
      iVar9 = (int)local_38;
      if (nNew <= (int)local_38) {
        iVar9 = nNew;
      }
      puVar1 = pPg->aCellIdx;
      memmove(puVar1 + iVar9 * 2,puVar1,(long)(int)(uVar12 * 2));
      iVar4 = pageInsertArray(pPg,pBegin,&local_58,puVar1,iVar6,iVar9,pCArray);
      if (iVar4 != 0) goto LAB_001441fc;
      uVar12 = iVar9 + uVar12;
    }
    if (pPg->nOverflow != '\0') {
      uVar8 = 0;
      do {
        iVar6 = (uint)pPg->aiOvfl[uVar8] + iOld;
        uVar5 = iVar6 - (int)uVar10;
        bVar13 = true;
        if ((int)uVar5 < nNew && -1 < (int)uVar5) {
          puVar1 = pPg->aCellIdx + (ulong)uVar5 * 2;
          memmove(pPg->aCellIdx + (ulong)uVar5 * 2 + 2,puVar1,(long)(int)((uVar12 - uVar5) * 2));
          uVar10 = local_50;
          uVar12 = uVar12 + 1;
          iVar6 = pageInsertArray(pPg,pBegin,&local_58,puVar1,iVar6,1,pCArray);
          bVar13 = iVar6 == 0;
        }
        iVar6 = (int)uVar10;
        if (!bVar13) goto LAB_001441fc;
        uVar8 = uVar8 + 1;
      } while (uVar8 < pPg->nOverflow);
    }
    iVar9 = pageInsertArray(pPg,pBegin,&local_58,pPg->aCellIdx + (int)(uVar12 * 2),uVar12 + iVar6,
                            nNew - uVar12,pCArray);
    if (iVar9 == 0) {
      pPg->nCell = (u16)nNew;
      pPg->nOverflow = '\0';
      local_48[local_40 + 3] = (u8)((uint)nNew >> 8);
      local_48[local_40 + 4] = (u8)pPg->nCell;
      uVar3 = (ushort)((int)local_58 - (int)local_48);
      *(ushort *)(local_48 + local_40 + 5) = uVar3 << 8 | uVar3 >> 8;
      return 0;
    }
  }
LAB_001441fc:
  lVar7 = (long)iVar6;
  if (0 < nNew) {
    lVar11 = lVar7 * 2;
    iVar6 = nNew + 1;
    do {
      if (*(short *)((long)pCArray->szCell + lVar11) == 0) {
        uVar2 = (*pCArray->pRef->xCellSize)
                          (pCArray->pRef,*(u8 **)((long)pCArray->apCell + lVar11 * 4));
        *(u16 *)((long)pCArray->szCell + lVar11) = uVar2;
      }
      lVar11 = lVar11 + 2;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  iVar6 = rebuildPage(pPg,nNew,pCArray->apCell + lVar7,pCArray->szCell + lVar7);
  return iVar6;
}

Assistant:

static int editPage(
  MemPage *pPg,                   /* Edit this page */
  int iOld,                       /* Index of first cell currently on page */
  int iNew,                       /* Index of new first cell on page */
  int nNew,                       /* Final number of cells on page */
  CellArray *pCArray              /* Array of cells and sizes */
){
  u8 * const aData = pPg->aData;
  const int hdr = pPg->hdrOffset;
  u8 *pBegin = &pPg->aCellIdx[nNew * 2];
  int nCell = pPg->nCell;       /* Cells stored on pPg */
  u8 *pData;
  u8 *pCellptr;
  int i;
  int iOldEnd = iOld + pPg->nCell + pPg->nOverflow;
  int iNewEnd = iNew + nNew;

#ifdef SQLITE_DEBUG
  u8 *pTmp = sqlite3PagerTempSpace(pPg->pBt->pPager);
  memcpy(pTmp, aData, pPg->pBt->usableSize);
#endif

  /* Remove cells from the start and end of the page */
  if( iOld<iNew ){
    int nShift = pageFreeArray(pPg, iOld, iNew-iOld, pCArray);
    memmove(pPg->aCellIdx, &pPg->aCellIdx[nShift*2], nCell*2);
    nCell -= nShift;
  }
  if( iNewEnd < iOldEnd ){
    nCell -= pageFreeArray(pPg, iNewEnd, iOldEnd - iNewEnd, pCArray);
  }

  pData = &aData[get2byteNotZero(&aData[hdr+5])];
  if( pData<pBegin ) goto editpage_fail;

  /* Add cells to the start of the page */
  if( iNew<iOld ){
    int nAdd = MIN(nNew,iOld-iNew);
    assert( (iOld-iNew)<nNew || nCell==0 || CORRUPT_DB );
    pCellptr = pPg->aCellIdx;
    memmove(&pCellptr[nAdd*2], pCellptr, nCell*2);
    if( pageInsertArray(
          pPg, pBegin, &pData, pCellptr,
          iNew, nAdd, pCArray
    ) ) goto editpage_fail;
    nCell += nAdd;
  }

  /* Add any overflow cells */
  for(i=0; i<pPg->nOverflow; i++){
    int iCell = (iOld + pPg->aiOvfl[i]) - iNew;
    if( iCell>=0 && iCell<nNew ){
      pCellptr = &pPg->aCellIdx[iCell * 2];
      memmove(&pCellptr[2], pCellptr, (nCell - iCell) * 2);
      nCell++;
      if( pageInsertArray(
            pPg, pBegin, &pData, pCellptr,
            iCell+iNew, 1, pCArray
      ) ) goto editpage_fail;
    }
  }

  /* Append cells to the end of the page */
  pCellptr = &pPg->aCellIdx[nCell*2];
  if( pageInsertArray(
        pPg, pBegin, &pData, pCellptr,
        iNew+nCell, nNew-nCell, pCArray
  ) ) goto editpage_fail;

  pPg->nCell = nNew;
  pPg->nOverflow = 0;

  put2byte(&aData[hdr+3], pPg->nCell);
  put2byte(&aData[hdr+5], pData - aData);

#ifdef SQLITE_DEBUG
  for(i=0; i<nNew && !CORRUPT_DB; i++){
    u8 *pCell = pCArray->apCell[i+iNew];
    int iOff = get2byteAligned(&pPg->aCellIdx[i*2]);
    if( SQLITE_WITHIN(pCell, aData, &aData[pPg->pBt->usableSize]) ){
      pCell = &pTmp[pCell - aData];
    }
    assert( 0==memcmp(pCell, &aData[iOff],
            pCArray->pRef->xCellSize(pCArray->pRef, pCArray->apCell[i+iNew])) );
  }
#endif

  return SQLITE_OK;
 editpage_fail:
  /* Unable to edit this page. Rebuild it from scratch instead. */
  populateCellCache(pCArray, iNew, nNew);
  return rebuildPage(pPg, nNew, &pCArray->apCell[iNew], &pCArray->szCell[iNew]);
}